

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deString.c
# Opt level: O1

char * deStrcpy(char *dst,size_t size,char *src)

{
  char *pcVar1;
  
  pcVar1 = strncpy(dst,src,size);
  return pcVar1;
}

Assistant:

char* deStrcpy (char* dst, size_t size, const char* src)
{
#if (DE_COMPILER == DE_COMPILER_MSC) && (DE_OS != DE_OS_WINCE)
	(void)strcpy_s(dst, size, src);
	return dst;
#else
	return strncpy(dst, src, size);
#endif
}